

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int mriStepInnerStepper_Resize
              (MRIStepInnerStepper stepper,ARKVecResizeFn resize,void *resize_data,
              sunindextype lrw_diff,sunindextype liw_diff,N_Vector tmpl)

{
  int iVar1;
  long *in_RDX;
  sunindextype in_ESI;
  long *in_RDI;
  undefined4 in_R8D;
  int retval;
  undefined4 in_stack_ffffffffffffffb4;
  void *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int local_4;
  
  if (in_RDI == (long *)0x0) {
    local_4 = -0x16;
  }
  else {
    iVar1 = arkResizeVecArray((ARKVecResizeFn)
                              CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                              in_stack_ffffffffffffffc0,(int)((ulong)(in_RDI + 0xb) >> 0x20),
                              (N_Vector)CONCAT44(in_stack_ffffffffffffffb4,in_R8D),
                              (N_Vector **)(in_RDI + 10),0,in_RDX,in_ESI,in_RDI);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      local_4 = -0x14;
    }
  }
  return local_4;
}

Assistant:

int mriStepInnerStepper_Resize(MRIStepInnerStepper stepper,
                               ARKVecResizeFn resize, void* resize_data,
                               sunindextype lrw_diff, sunindextype liw_diff,
                               N_Vector tmpl)
{
  int retval;

  if (stepper == NULL) return ARK_ILL_INPUT;

  retval = arkResizeVecArray(resize, resize_data,
                             stepper->nforcing, tmpl, &(stepper->forcing),
                             lrw_diff, &(stepper->lrw),
                             liw_diff, &(stepper->liw));
  if (retval != ARK_SUCCESS) return(ARK_MEM_FAIL);

  return(ARK_SUCCESS);
}